

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

void __thiscall
OpenMD::Integrator::setFluctuatingChargePropagator
          (Integrator *this,FluctuatingChargePropagator *prop)

{
  FluctuatingChargePropagator *pFVar1;
  
  pFVar1 = this->flucQ_;
  if (pFVar1 != (FluctuatingChargePropagator *)0x0 && pFVar1 != prop) {
    (*pFVar1->_vptr_FluctuatingChargePropagator[1])();
  }
  this->flucQ_ = prop;
  if (this->forceMan_ != (ForceManager *)0x0) {
    (*prop->_vptr_FluctuatingChargePropagator[9])(prop);
    return;
  }
  return;
}

Assistant:

void Integrator::setFluctuatingChargePropagator(
      FluctuatingChargePropagator* prop) {
    if (prop != flucQ_ && flucQ_ != NULL) { delete flucQ_; }
    flucQ_ = prop;
    if (forceMan_ != NULL) { flucQ_->setForceManager(forceMan_); }
  }